

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::SchemeFrame::setExpression(SchemeFrame *this,cell *value)

{
  bool bVar1;
  cell val;
  cell cStack_78;
  
  this->resolved = false;
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  _M_erase_at_end(&this->arguments,
                  (this->arguments).
                  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  _M_erase_at_end(&this->resolved_arguments,
                  (this->resolved_arguments).
                  super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  cell::cell(&cStack_78,value);
  bVar1 = resolveExpression(this,&cStack_78);
  (this->arg_it)._M_current =
       (this->arguments).
       super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (bVar1) {
    std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
    _M_erase_at_end(&this->resolved_arguments,
                    (this->resolved_arguments).
                    super__Vector_base<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    this->resolved = true;
  }
  else {
    nextArgument(this);
  }
  if (cStack_78.env.
      super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (cStack_78.env.
               super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&cStack_78.list);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)cStack_78.val._M_dataplus._M_p != &cStack_78.val.field_2) {
    operator_delete(cStack_78.val._M_dataplus._M_p,cStack_78.val.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void setExpression(const cell &value) {
		DEBUG("setExpression(" + to_string(value) + ")");
		resolved = false;
		arguments.clear();
		resolved_arguments.clear();
		cell val(value);
		if (resolveExpression(val)) {
			arg_it = arguments.cbegin();
			resolved_arguments.clear();
			resolved = true;
			return;
		}
		arg_it = arguments.cbegin();
		nextArgument();
	}